

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::focusOutEvent(QGraphicsScene *this,QFocusEvent *focusEvent)

{
  bool bVar1;
  QGraphicsScenePrivate *item;
  QGraphicsScene *in_RSI;
  QList<QGraphicsWidget_*> *in_RDI;
  QGraphicsScenePrivate *d;
  bool in_stack_0000002f;
  QGraphicsScenePrivate *in_stack_00000030;
  QGraphicsWidget *in_stack_00000040;
  
  item = d_func((QGraphicsScene *)0x9d23e1);
  *(uint *)&item->field_0xb8 = *(uint *)&item->field_0xb8 & 0xfffffbff;
  item->passiveFocusItem = item->focusItem;
  QFocusEvent::reason();
  setFocusItem(in_RSI,(QGraphicsItem *)item,(FocusReason)((ulong)in_RDI >> 0x20));
  bVar1 = QList<QGraphicsWidget_*>::isEmpty((QList<QGraphicsWidget_*> *)0x9d2443);
  if (!bVar1) {
    QList<QGraphicsWidget_*>::constFirst(in_RDI);
    QGraphicsScenePrivate::removePopup(in_stack_00000030,in_stack_00000040,in_stack_0000002f);
  }
  return;
}

Assistant:

void QGraphicsScene::focusOutEvent(QFocusEvent *focusEvent)
{
    Q_D(QGraphicsScene);
    d->hasFocus = false;
    d->passiveFocusItem = d->focusItem;
    setFocusItem(nullptr, focusEvent->reason());

    // Remove all popups when the scene loses focus.
    if (!d->popupWidgets.isEmpty())
        d->removePopup(d->popupWidgets.constFirst());
}